

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O1

FT_Error cff_size_request(FT_Size size,FT_Size_Request req)

{
  FT_Face pFVar1;
  FT_ULong FVar2;
  long b_;
  long c_;
  int iVar3;
  FT_Long a_;
  FT_Fixed FVar4;
  ulong uVar5;
  FT_ULong local_50;
  FT_ULong strike_index;
  undefined8 *local_40;
  PSH_Globals_Funcs local_38;
  
  pFVar1 = size->face;
  if ((pFVar1->face_flags & 2) != 0) {
    iVar3 = (**(code **)(*(long *)&pFVar1[3].units_per_EM + 0xd0))(pFVar1,req,&local_50);
    if (iVar3 == 0) {
      cff_size_select(size,local_50);
      return 0;
    }
    size[1].face = (FT_Face)0xffffffff;
  }
  FT_Request_Metrics(size->face,req);
  local_38 = cff_size_get_globals_funcs((CFF_Size)size);
  if (local_38 != (PSH_Globals_Funcs)0x0) {
    FVar2 = size->face[4].bbox.yMin;
    local_40 = (undefined8 *)size->internal->module_data;
    b_ = *(long *)(FVar2 + 0x6d0);
    (*local_38->set_scale)
              ((PSH_Globals)*local_40,(size->metrics).x_scale,(size->metrics).y_scale,0,0);
    strike_index = FVar2;
    for (uVar5 = (ulong)*(uint *)(FVar2 + 0xb30); uVar5 != 0; uVar5 = uVar5 - 1) {
      c_ = *(long *)(*(long *)(strike_index + 0xb30 + uVar5 * 8) + 0x68);
      a_ = (size->metrics).x_scale;
      if (b_ == c_) {
        FVar4 = (size->metrics).y_scale;
      }
      else {
        a_ = FT_MulDiv(a_,b_,c_);
        FVar4 = FT_MulDiv((size->metrics).y_scale,b_,c_);
      }
      (*local_38->set_scale)((PSH_Globals)local_40[uVar5],a_,FVar4,0,0);
    }
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_size_request( FT_Size          size,
                    FT_Size_Request  req )
  {
    CFF_Size           cffsize = (CFF_Size)size;
    PSH_Globals_Funcs  funcs;


#ifdef TT_CONFIG_OPTION_EMBEDDED_BITMAPS

    if ( FT_HAS_FIXED_SIZES( size->face ) )
    {
      CFF_Face      cffface = (CFF_Face)size->face;
      SFNT_Service  sfnt    = (SFNT_Service)cffface->sfnt;
      FT_ULong      strike_index;


      if ( sfnt->set_sbit_strike( cffface, req, &strike_index ) )
        cffsize->strike_index = 0xFFFFFFFFUL;
      else
        return cff_size_select( size, strike_index );
    }

#endif /* TT_CONFIG_OPTION_EMBEDDED_BITMAPS */

    FT_Request_Metrics( size->face, req );

    funcs = cff_size_get_globals_funcs( cffsize );

    if ( funcs )
    {
      CFF_Face      cffface  = (CFF_Face)size->face;
      CFF_Font      font     = (CFF_Font)cffface->extra.data;
      CFF_Internal  internal = (CFF_Internal)size->internal->module_data;

      FT_Long  top_upm  = (FT_Long)font->top_font.font_dict.units_per_em;
      FT_UInt  i;


      funcs->set_scale( internal->topfont,
                        size->metrics.x_scale, size->metrics.y_scale,
                        0, 0 );

      for ( i = font->num_subfonts; i > 0; i-- )
      {
        CFF_SubFont  sub     = font->subfonts[i - 1];
        FT_Long      sub_upm = (FT_Long)sub->font_dict.units_per_em;
        FT_Pos       x_scale, y_scale;


        if ( top_upm != sub_upm )
        {
          x_scale = FT_MulDiv( size->metrics.x_scale, top_upm, sub_upm );
          y_scale = FT_MulDiv( size->metrics.y_scale, top_upm, sub_upm );
        }
        else
        {
          x_scale = size->metrics.x_scale;
          y_scale = size->metrics.y_scale;
        }

        funcs->set_scale( internal->subfonts[i - 1],
                          x_scale, y_scale, 0, 0 );
      }
    }

    return FT_Err_Ok;
  }